

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vvc.cpp
# Opt level: O2

bool __thiscall
VvcUnit::ols_timing_hrd_parameters
          (VvcUnit *this,VvcHrdUnit m_hrd,int firstSubLayer,int MaxSubLayersVal)

{
  BitStreamReader *this_00;
  bool bVar1;
  uint uVar2;
  int i;
  undefined8 uVar3;
  VvcHrdUnit m_hrd_00;
  VvcHrdUnit m_hrd_01;
  
  m_hrd_00._8_8_ = m_hrd._8_8_;
  uVar3 = m_hrd._0_8_;
  this_00 = &this->m_reader;
  for (; firstSubLayer <= MaxSubLayersVal; firstSubLayer = firstSubLayer + 1) {
    bVar1 = BitStreamReader::getBit(this_00);
    if ((bVar1) || (bVar1 = BitStreamReader::getBit(this_00), bVar1)) {
      uVar2 = extractUEGolombCode(this);
      if (0x7ff < uVar2) break;
LAB_001eff57:
      if (((undefined1  [16])m_hrd & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
LAB_001eff5d:
        m_hrd_00.num_units_in_tick = (int)uVar3;
        m_hrd_00.time_scale = (int)((ulong)uVar3 >> 0x20);
        sublayer_hrd_parameters(this,m_hrd_00);
      }
    }
    else {
      if (((undefined1  [16])m_hrd & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        if (m_hrd_00._8_8_ >> 0x20 == 0) goto LAB_001eff95;
        goto LAB_001eff5d;
      }
      if ((m_hrd_00._8_8_ & 0xffffffff00000100) == 0x100) {
LAB_001eff95:
        BitStreamReader::skipBit(this_00);
        goto LAB_001eff57;
      }
    }
    if ((m_hrd._8_4_ >> 8 & 1) != 0) {
      m_hrd_01.general_nal_hrd_params_present_flag = (bool)(char)m_hrd_00._8_8_;
      m_hrd_01.general_vcl_hrd_params_present_flag = (bool)(char)(m_hrd_00._8_8_ >> 8);
      m_hrd_01.general_du_hrd_params_present_flag = (bool)(char)(m_hrd_00._8_8_ >> 0x10);
      m_hrd_01._11_1_ = (char)(m_hrd_00._8_8_ >> 0x18);
      m_hrd_01.hrd_cpb_cnt_minus1 = (int)(m_hrd_00._8_8_ >> 0x20);
      m_hrd_01.num_units_in_tick = (int)uVar3;
      m_hrd_01.time_scale = (int)((ulong)uVar3 >> 0x20);
      sublayer_hrd_parameters(this,m_hrd_01);
    }
  }
  return firstSubLayer <= MaxSubLayersVal;
}

Assistant:

bool VvcUnit::ols_timing_hrd_parameters(const VvcHrdUnit m_hrd, const int firstSubLayer, const int MaxSubLayersVal)
{
    for (int i = firstSubLayer; i <= MaxSubLayersVal; i++)
    {
        const bool fixed_pic_rate_within_cvs_flag =
            m_reader.getBit() /* fixed_pic_rate_general_flag) */ ? true : m_reader.getBit();
        if (fixed_pic_rate_within_cvs_flag)
        {
            if (extractUEGolombCode() > 2047)  // elemental_duration_in_tc_minus1
                return true;
        }
        else if ((m_hrd.general_nal_hrd_params_present_flag || m_hrd.general_vcl_hrd_params_present_flag) &&
                 m_hrd.hrd_cpb_cnt_minus1 == 0)
            m_reader.skipBit();  // low_delay_hrd_flag
        if (m_hrd.general_nal_hrd_params_present_flag)
            sublayer_hrd_parameters(m_hrd);
        if (m_hrd.general_vcl_hrd_params_present_flag)
            sublayer_hrd_parameters(m_hrd);
    }
    return false;
}